

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall ads2_checkSinn2_Test::TestBody(ads2_checkSinn2_Test *this)

{
  bool bVar1;
  char *message;
  double rhs_value;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ads2_checkSinn2_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  rhs_value = (double)sinn(1.57,10);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_20,"0.9999996829318345","sinn(3.14/2, 10)",0.9999996829318345,
             rhs_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/NNTU-CS[P]ADS-2/test/tests.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(ads2, checkSinn2) {
  EXPECT_DOUBLE_EQ(0.9999996829318345, sinn(3.14/2, 10));
}